

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::detail::
arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>::
write_int<long_long>
          (arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
           *this,longlong value,format_specs *spec)

{
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long> *in_RDI;
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long> w;
  basic_format_specs<char> *s;
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long> *in_stack_ffffffffffffffc0
  ;
  locale_ref in_stack_ffffffffffffffc8;
  buffer_appender<char> in_stack_ffffffffffffffd0;
  
  s = (basic_format_specs<char> *)(in_RDI->locale).locale_;
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long>::int_writer<long_long>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             (longlong)
             (in_RDI->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,s);
  handle_int_type_spec<fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,char,unsigned_long>&>
            ((char)((ulong)s >> 0x38),in_RDI);
  (in_RDI->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (buffer<char> *)in_stack_ffffffffffffffc0;
  return;
}

Assistant:

void write_int(T value, const format_specs& spec) {
    using uint_type = uint32_or_64_or_128_t<T>;
    int_writer<iterator, Char, uint_type> w(out_, locale_, value, spec);
    handle_int_type_spec(spec.type, w);
    out_ = w.out;
  }